

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

void __thiscall kj::Path::validatePart(Path *this,StringPtr part)

{
  int iVar1;
  char *pcVar2;
  void *pvVar3;
  char *pcVar4;
  Fault f;
  StringPtr part_local;
  
  pcVar4 = part.content.ptr;
  part_local.content.ptr = (char *)this;
  part_local.content.size_ = (size_t)pcVar4;
  if (pcVar4 == (char *)0x2) {
    pcVar2 = ".";
  }
  else {
    if (pcVar4 != (char *)0x3) {
      if (pcVar4 != (char *)0x1) goto LAB_0023c503;
      goto LAB_0023c49d;
    }
    pcVar2 = "..";
  }
  iVar1 = bcmp(this,pcVar2,(size_t)(pcVar4 + -1));
  if (iVar1 != 0) {
LAB_0023c503:
    pcVar2 = (char *)strlen((char *)this);
    if (pcVar2 != pcVar4 + -1) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32],kj::StringPtr&>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x130,FAILED,"strlen(part.begin()) == part.size()",
                 "\"NUL character in path component\", part",
                 (char (*) [32])"NUL character in path component",&part_local);
      kj::_::Debug::Fault::fatal(&f);
    }
    pvVar3 = memchr(this,0x2f,(size_t)(pcVar4 + -1));
    if (pvVar3 == (void *)0x0) {
      return;
    }
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[68],kj::StringPtr&>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x132,FAILED,"part.findFirst(\'/\') == nullptr",
               "\"\'/\' character in path component; did you mean to use Path::parse()?\", part",
               (char (*) [68])
               "\'/\' character in path component; did you mean to use Path::parse()?",&part_local);
    kj::_::Debug::Fault::fatal(&f);
  }
LAB_0023c49d:
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[23],kj::StringPtr&>
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
             ,0x12f,FAILED,"part != \"\" && part != \".\" && part != \"..\"",
             "\"invalid path component\", part",(char (*) [23])"invalid path component",&part_local)
  ;
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

void Path::validatePart(StringPtr part) {
  KJ_REQUIRE(part != "" && part != "." && part != "..", "invalid path component", part);
  KJ_REQUIRE(strlen(part.begin()) == part.size(), "NUL character in path component", part);
  KJ_REQUIRE(part.findFirst('/') == nullptr,
      "'/' character in path component; did you mean to use Path::parse()?", part);
}